

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3Fts5TermsetAdd(Fts5Termset *p,int iIdx,char *pTerm,int nTerm,int *pbPresent)

{
  Fts5TermsetEntry **ppFVar1;
  int iVar2;
  Fts5TermsetEntry *pFVar3;
  ulong uVar4;
  uint uVar5;
  size_t __n;
  Fts5TermsetEntry **ppFVar6;
  long in_FS_OFFSET;
  int rc;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  rc = 0;
  *pbPresent = 0;
  if (p != (Fts5Termset *)0x0) {
    uVar5 = 0xd;
    for (uVar4 = (ulong)(uint)nTerm; 0 < (int)uVar4; uVar4 = uVar4 - 1) {
      uVar5 = uVar5 * 8 ^ uVar5 ^ (int)pTerm[uVar4 - 1];
    }
    __n = (size_t)nTerm;
    ppFVar1 = p->apHash + ((uVar5 << 3 ^ iIdx ^ uVar5) & 0x1ff);
    ppFVar6 = ppFVar1;
    while (pFVar3 = *ppFVar6, pFVar3 != (Fts5TermsetEntry *)0x0) {
      if ((pFVar3->iIdx == iIdx) && (pFVar3->nTerm == nTerm)) {
        iVar2 = bcmp(pFVar3->pTerm,pTerm,__n);
        if (iVar2 == 0) {
          *pbPresent = 1;
          goto LAB_001d327a;
        }
      }
      ppFVar6 = &pFVar3->pNext;
    }
    pFVar3 = (Fts5TermsetEntry *)sqlite3Fts5MallocZero(&rc,__n + 0x18);
    if (pFVar3 != (Fts5TermsetEntry *)0x0) {
      pFVar3->pTerm = (char *)(pFVar3 + 1);
      pFVar3->nTerm = nTerm;
      pFVar3->iIdx = iIdx;
      memcpy(pFVar3 + 1,pTerm,__n);
      pFVar3->pNext = *ppFVar1;
      *ppFVar1 = pFVar3;
    }
  }
LAB_001d327a:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return rc;
  }
  __stack_chk_fail();
}

Assistant:

static int sqlite3Fts5TermsetAdd(
  Fts5Termset *p,
  int iIdx,
  const char *pTerm, int nTerm,
  int *pbPresent
){
  int rc = SQLITE_OK;
  *pbPresent = 0;
  if( p ){
    int i;
    u32 hash = 13;
    Fts5TermsetEntry *pEntry;

    /* Calculate a hash value for this term. This is the same hash checksum
    ** used by the fts5_hash.c module. This is not important for correct
    ** operation of the module, but is necessary to ensure that some tests
    ** designed to produce hash table collisions really do work.  */
    for(i=nTerm-1; i>=0; i--){
      hash = (hash << 3) ^ hash ^ pTerm[i];
    }
    hash = (hash << 3) ^ hash ^ iIdx;
    hash = hash % ArraySize(p->apHash);

    for(pEntry=p->apHash[hash]; pEntry; pEntry=pEntry->pNext){
      if( pEntry->iIdx==iIdx
          && pEntry->nTerm==nTerm
          && memcmp(pEntry->pTerm, pTerm, nTerm)==0
      ){
        *pbPresent = 1;
        break;
      }
    }

    if( pEntry==0 ){
      pEntry = sqlite3Fts5MallocZero(&rc, sizeof(Fts5TermsetEntry) + nTerm);
      if( pEntry ){
        pEntry->pTerm = (char*)&pEntry[1];
        pEntry->nTerm = nTerm;
        pEntry->iIdx = iIdx;
        memcpy(pEntry->pTerm, pTerm, nTerm);
        pEntry->pNext = p->apHash[hash];
        p->apHash[hash] = pEntry;
      }
    }
  }

  return rc;
}